

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O0

void mergesort_losertree_parallel<128u>(uchar **strings,size_t n,uchar **tmp)

{
  uchar **strings_00;
  size_t n_00;
  ostream *poVar1;
  ulong uVar2;
  reference pvVar3;
  iterator begin;
  iterator end;
  uchar *puVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_890 [8];
  loser_tree<unsigned_char_*> tree;
  uchar **result;
  unsigned_long uStack_868;
  uint i_1;
  uchar **local_860;
  pair<unsigned_char_**,_unsigned_long> local_858;
  uchar **local_848;
  pair<unsigned_char_**,_unsigned_long> local_840;
  uint local_82c;
  undefined1 local_828 [4];
  uint i;
  array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> ranges;
  size_t split;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    mergesort_4way_parallel(strings,n,tmp);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"mergesort_losertree_parallel");
    poVar1 = std::operator<<(poVar1,"(), n=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    auVar6._8_4_ = (int)(n >> 0x20);
    auVar6._0_8_ = n;
    auVar6._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.0078125;
    uVar2 = (ulong)dVar5;
    ranges._M_elems[0x7f].second =
         uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::array
              ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828);
    for (local_82c = 0; local_82c < 0x7f; local_82c = local_82c + 1) {
      local_848 = strings + local_82c * ranges._M_elems[0x7f].second;
      local_840 = std::make_pair<unsigned_char**,unsigned_long_const&>
                            (&local_848,&ranges._M_elems[0x7f].second);
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828,
                          (ulong)local_82c);
      std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_840);
    }
    local_860 = strings + ranges._M_elems[0x7f].second * 0x7f;
    uStack_868 = n + ranges._M_elems[0x7f].second * -0x7f;
    local_858 = std::make_pair<unsigned_char**,unsigned_long>(&local_860,&stack0xfffffffffffff798);
    pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::operator[]
                       ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828,0x7f);
    std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_858);
    for (result._4_4_ = 0; result._4_4_ < 0x80; result._4_4_ = result._4_4_ + 1) {
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828,
                          (ulong)result._4_4_);
      strings_00 = pvVar3->first;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828,
                          (ulong)result._4_4_);
      n_00 = pvVar3->second;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828,
                          (ulong)result._4_4_);
      mergesort_losertree_parallel<128u>
                (strings_00,n_00,tmp + ((long)pvVar3->first - (long)strings >> 3));
    }
    tree._16_8_ = tmp;
    begin = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::begin
                      ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828);
    end = std::array<std::pair<unsigned_char_**,_unsigned_long>,_128UL>::end
                    ((array<std::pair<unsigned_char_**,_unsigned_long>,_128UL> *)local_828);
    loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
              ((loser_tree<unsigned_char*> *)local_890,begin,end);
    while ((int)tree._streams != 0) {
      puVar4 = loser_tree<unsigned_char_*>::min((loser_tree<unsigned_char_*> *)local_890);
      *(uchar **)tree._16_8_ = puVar4;
      tree._16_8_ = tree._16_8_ + 8;
    }
    memcpy(strings,tmp,n << 3);
    loser_tree<unsigned_char_*>::~loser_tree((loser_tree<unsigned_char_*> *)local_890);
  }
  return;
}

Assistant:

static void
mergesort_losertree_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way_parallel(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
#pragma omp parallel for
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree_parallel<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}